

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
__thiscall
duckdb::StringValueScanner::GetCSVScanner
          (StringValueScanner *this,ClientContext *context,CSVReaderOptions *options,
          MultiFileOptions *file_options)

{
  idx_t iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> this_01;
  bool bVar3;
  CSVStateMachineCache *__args_2;
  CSVStateMachine *pCVar4;
  idx_t iVar5;
  StringValueScanner *this_02;
  pointer pSVar6;
  CSVFileScan *this_03;
  CSVFileScan *__tmp;
  ulong rows_to_skip;
  shared_ptr<duckdb::CSVStateMachine,_true> state_machine;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  CSVIterator it;
  undefined1 local_d9;
  shared_ptr<duckdb::CSVStateMachine,_true> local_d8;
  undefined8 local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> local_b8;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_b0;
  shared_ptr<duckdb::CSVBufferManager,_true> local_a0;
  shared_ptr<duckdb::CSVBufferManager,_true> local_90;
  MultiFileOptions *local_80;
  CSVIterator local_78;
  
  local_80 = file_options;
  __args_2 = CSVStateMachineCache::Get(context);
  local_78.pos.buffer_idx = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVStateMachine,std::allocator<duckdb::CSVStateMachine>,duckdb::CSVReaderOptions&,duckdb::CSVStateMachineOptions&,duckdb::CSVStateMachineCache&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.pos.buffer_pos,
             (CSVStateMachine **)&local_78,(allocator<duckdb::CSVStateMachine> *)&local_c8,options,
             (CSVStateMachineOptions *)options,__args_2);
  local_d8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78.pos.buffer_idx;
  local_d8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78.pos.buffer_pos + 8) =
           *(_Atomic_word *)(local_78.pos.buffer_pos + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00d039bc;
    }
    else {
      *(_Atomic_word *)(local_78.pos.buffer_pos + 8) =
           *(_Atomic_word *)(local_78.pos.buffer_pos + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos);
  }
LAB_00d039bc:
  iVar1 = (options->dialect_options).num_cols;
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  (pCVar4->dialect_options).num_cols = iVar1;
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  (pCVar4->dialect_options).header = (options->dialect_options).header;
  local_c8 = (CSVFileScan *)((ulong)local_c8._4_4_ << 0x20);
  local_78.pos.buffer_idx = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.pos.buffer_pos,
             (CSVBufferManager **)&local_78,(allocator<duckdb::CSVBufferManager> *)&local_b0,context
             ,options,&options->file_path,(int *)&local_c8);
  local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_78.pos.buffer_idx;
  local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78.pos.buffer_pos + 8) =
           *(_Atomic_word *)(local_78.pos.buffer_pos + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00d03a5c;
    }
    else {
      *(_Atomic_word *)(local_78.pos.buffer_pos + 8) =
           *(_Atomic_word *)(local_78.pos.buffer_pos + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pos.buffer_pos);
  }
LAB_00d03a5c:
  local_b8._M_head_impl = this;
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  iVar5 = CSVReaderOptions::GetSkipRows(pCVar4->options);
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  bVar3 = CSVReaderOptions::GetHeader(pCVar4->options);
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  iVar1 = (pCVar4->dialect_options).rows_until_header;
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&local_d8);
  rows_to_skip = iVar1 + (pCVar4->dialect_options).header.value;
  if (rows_to_skip < iVar5 + bVar3) {
    rows_to_skip = iVar5 + bVar3;
  }
  local_90.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  local_90.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  BaseScanner::SkipCSVRows(&local_78,&local_90,&local_d8,rows_to_skip);
  if (local_90.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_c8 = (CSVFileScan *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVErrorHandler,std::allocator<duckdb::CSVErrorHandler>>
            (&local_c0,(CSVErrorHandler **)&local_c8,(allocator<duckdb::CSVErrorHandler> *)&local_d9
            );
  local_b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  local_b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_c0._M_pi;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_c0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00d03b6b;
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
LAB_00d03b6b:
  this_02 = (StringValueScanner *)operator_new(0x4c8);
  StringValueScanner(this_02,&local_a0,&local_d8,&local_b0,0x800,&local_78);
  this_01._M_head_impl = local_b8._M_head_impl;
  ((local_b8._M_head_impl)->super_BaseScanner)._vptr_BaseScanner = (_func_int **)this_02;
  if (local_b0.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_c8 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVFileScan,std::allocator<duckdb::CSVFileScan>,duckdb::ClientContext&,std::__cxx11::string&,duckdb::CSVReaderOptions&,duckdb::MultiFileOptions_const&>
            (&local_c0,(CSVFileScan **)&local_c8,(allocator<duckdb::CSVFileScan> *)&local_b0,context
             ,&options->file_path,options,local_80);
  peVar2 = local_c8;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_c0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00d03c1a;
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
LAB_00d03c1a:
  pSVar6 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)this_01._M_head_impl);
  (pSVar6->super_BaseScanner).csv_file_scan.internal.
  super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  this_00 = (pSVar6->super_BaseScanner).csv_file_scan.internal.
            super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pSVar6->super_BaseScanner).csv_file_scan.internal.
  super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_c0._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar6 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)this_01._M_head_impl);
  this_03 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                      (&(pSVar6->super_BaseScanner).csv_file_scan);
  CSVFileScan::InitializeProjection(this_03);
  if (local_a0.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_d8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.internal.
               super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         this_01._M_head_impl;
}

Assistant:

unique_ptr<StringValueScanner> StringValueScanner::GetCSVScanner(ClientContext &context, CSVReaderOptions &options,
                                                                 const MultiFileOptions &file_options) {
	auto state_machine = make_shared_ptr<CSVStateMachine>(options, options.dialect_options.state_machine_options,
	                                                      CSVStateMachineCache::Get(context));

	state_machine->dialect_options.num_cols = options.dialect_options.num_cols;
	state_machine->dialect_options.header = options.dialect_options.header;
	auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, options, options.file_path, 0);
	idx_t rows_to_skip = state_machine->options.GetSkipRows() + state_machine->options.GetHeader();
	rows_to_skip = std::max(rows_to_skip, state_machine->dialect_options.rows_until_header +
	                                          state_machine->dialect_options.header.GetValue());
	auto it = BaseScanner::SkipCSVRows(buffer_manager, state_machine, rows_to_skip);
	auto scanner = make_uniq<StringValueScanner>(buffer_manager, state_machine, make_shared_ptr<CSVErrorHandler>(),
	                                             STANDARD_VECTOR_SIZE, it);
	scanner->csv_file_scan = make_shared_ptr<CSVFileScan>(context, options.file_path, options, file_options);
	scanner->csv_file_scan->InitializeProjection();
	return scanner;
}